

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterReverseNewPage(Fts5Index *p,Fts5SegIter *pIter)

{
  bool bVar1;
  byte bVar2;
  u16 uVar3;
  uint uVar4;
  Fts5Data *pFVar5;
  Fts5SegIter *in_RSI;
  Fts5Index *in_RDI;
  i64 in_stack_00000008;
  u8 *a;
  int iRowidOff;
  Fts5Data *pNew;
  
  fts5DataRelease((Fts5Data *)0x270acc);
  in_RSI->pLeaf = (Fts5Data *)0x0;
  while( true ) {
    do {
      bVar1 = false;
      if (in_RDI->rc == 0) {
        bVar1 = in_RSI->iTermLeafPgno < in_RSI->iLeafPgno;
      }
      if (!bVar1) goto LAB_00270c6c;
      in_RSI->iLeafPgno = in_RSI->iLeafPgno + -1;
      pFVar5 = fts5DataRead((Fts5Index *)a,in_stack_00000008);
    } while (pFVar5 == (Fts5Data *)0x0);
    if (in_RSI->iLeafPgno == in_RSI->iTermLeafPgno) {
      if (in_RSI->iTermLeafOffset < pFVar5->szLeaf) {
        in_RSI->pLeaf = pFVar5;
        in_RSI->iLeafOffset = (long)in_RSI->iTermLeafOffset;
      }
    }
    else {
      uVar3 = fts5GetU16(pFVar5->p);
      uVar4 = (uint)uVar3;
      if (uVar4 != 0) {
        if ((int)uVar4 < pFVar5->szLeaf) {
          in_RSI->pLeaf = pFVar5;
          in_RSI->iLeafOffset = (long)(int)uVar4;
        }
        else {
          in_RDI->rc = 0x10b;
        }
      }
    }
    if (in_RSI->pLeaf != (Fts5Data *)0x0) break;
    fts5DataRelease((Fts5Data *)0x270c65);
  }
  bVar2 = sqlite3Fts5GetVarint(in_RSI->pLeaf->p + in_RSI->iLeafOffset,(u64 *)&in_RSI->iRowid);
  in_RSI->iLeafOffset = (ulong)bVar2 + in_RSI->iLeafOffset;
LAB_00270c6c:
  if (in_RSI->pLeaf != (Fts5Data *)0x0) {
    in_RSI->iEndofDoclist = in_RSI->pLeaf->nn + 1;
    fts5SegIterReverseInitPage(in_RDI,in_RSI);
  }
  return;
}

Assistant:

static void fts5SegIterReverseNewPage(Fts5Index *p, Fts5SegIter *pIter){
  assert( pIter->flags & FTS5_SEGITER_REVERSE );
  assert( pIter->flags & FTS5_SEGITER_ONETERM );

  fts5DataRelease(pIter->pLeaf);
  pIter->pLeaf = 0;
  while( p->rc==SQLITE_OK && pIter->iLeafPgno>pIter->iTermLeafPgno ){
    Fts5Data *pNew;
    pIter->iLeafPgno--;
    pNew = fts5DataRead(p, FTS5_SEGMENT_ROWID(
          pIter->pSeg->iSegid, pIter->iLeafPgno
    ));
    if( pNew ){
      /* iTermLeafOffset may be equal to szLeaf if the term is the last
      ** thing on the page - i.e. the first rowid is on the following page.
      ** In this case leave pIter->pLeaf==0, this iterator is at EOF. */
      if( pIter->iLeafPgno==pIter->iTermLeafPgno ){
        assert( pIter->pLeaf==0 );
        if( pIter->iTermLeafOffset<pNew->szLeaf ){
          pIter->pLeaf = pNew;
          pIter->iLeafOffset = pIter->iTermLeafOffset;
        }
      }else{
        int iRowidOff;
        iRowidOff = fts5LeafFirstRowidOff(pNew);
        if( iRowidOff ){
          if( iRowidOff>=pNew->szLeaf ){
            p->rc = FTS5_CORRUPT;
          }else{
            pIter->pLeaf = pNew;
            pIter->iLeafOffset = iRowidOff;
          }
        }
      }

      if( pIter->pLeaf ){
        u8 *a = &pIter->pLeaf->p[pIter->iLeafOffset];
        pIter->iLeafOffset += fts5GetVarint(a, (u64*)&pIter->iRowid);
        break;
      }else{
        fts5DataRelease(pNew);
      }
    }
  }

  if( pIter->pLeaf ){
    pIter->iEndofDoclist = pIter->pLeaf->nn+1;
    fts5SegIterReverseInitPage(p, pIter);
  }
}